

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O3

bool __thiscall CodeGenWorkItem::ShouldSpeculativelyJitBasedOnProfile(CodeGenWorkItem *this)

{
  FunctionBody *this_00;
  SourceDynamicProfileManager *this_01;
  code *pcVar1;
  bool bVar2;
  ExecutionFlags EVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  SourceContextInfo *pSVar8;
  undefined4 *puVar9;
  FunctionInfo *pFVar10;
  
  this_00 = this->functionBody;
  uVar4 = Js::FunctionBody::GetCountField(this_00,ByteCodeInLoopCount);
  uVar5 = Js::FunctionBody::GetCountField(this_00,ByteCodeCount);
  uVar6 = Js::FunctionBody::GetCountField(this_00,ByteCodeCount);
  uVar7 = Js::FunctionBody::GetCountField(this_00,ByteCodeInLoopCount);
  if ((0x31 < (uVar4 * 100) / (uVar5 + 1)) || (uVar6 - uVar7 < 300)) {
    pSVar8 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)this_00);
    this_01 = (pSVar8->sourceDynamicProfileManager).ptr;
    if ((this_01 != (SourceDynamicProfileManager *)0x0) &&
       (Js::FunctionBody::SetIsSpeculativeJitCandidate(this_00),
       (this_00->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0)) {
      pFVar10 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar10 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar9 = 0;
        pFVar10 = (this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      EVar3 = Js::SourceDynamicProfileManager::IsFunctionExecuted(this_01,pFVar10->functionId);
      return EVar3 == ExecutionFlags_Executed;
    }
  }
  return false;
}

Assistant:

bool CodeGenWorkItem::ShouldSpeculativelyJitBasedOnProfile() const
{
    Js::FunctionBody* functionBody = this->GetFunctionBody();

    uint loopPercentage = (functionBody->GetByteCodeInLoopCount()*100) / (functionBody->GetByteCodeCount() + 1);
    uint straightLineSize = functionBody->GetByteCodeCount() - functionBody->GetByteCodeInLoopCount();

    // This ensures only small and loopy functions are prejitted.
    if(loopPercentage >= 50 || straightLineSize < 300)
    {
        Js::SourceDynamicProfileManager* profileManager = functionBody->GetSourceContextInfo()->sourceDynamicProfileManager;
        if(profileManager != nullptr)
        {
            functionBody->SetIsSpeculativeJitCandidate();

            if(!functionBody->HasDynamicProfileInfo())
            {
                return false;
            }

            Js::ExecutionFlags executionFlags = profileManager->IsFunctionExecuted(functionBody->GetLocalFunctionId());
            if(executionFlags == Js::ExecutionFlags_Executed)
            {
                return true;
            }
        }
    }
    return false;
}